

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::MultiplyPropagateStatistics::Operation<signed_char,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  Value *pVVar1;
  char cVar2;
  ushort uVar3;
  long lVar4;
  char cVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  char rvals [2];
  char lvals [2];
  char local_74 [4];
  Value local_70;
  
  local_74[2] = NumericStats::GetMin<signed_char>(lstats);
  local_74[3] = NumericStats::GetMax<signed_char>(lstats);
  local_74[0] = NumericStats::GetMin<signed_char>(rstats);
  local_74[1] = NumericStats::GetMax<signed_char>(rstats);
  uVar7 = 0x80;
  uVar3 = 0x7f;
  for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      uVar6 = (short)local_74[lVar4] * (short)local_74[uVar9 + 2];
      cVar5 = (char)uVar6;
      if ((short)cVar5 != uVar6) goto LAB_007fe620;
      cVar2 = (char)uVar3;
      uVar3 = uVar3 & 0xff;
      if (cVar5 <= cVar2) {
        uVar3 = uVar6;
      }
      uVar8 = uVar7 & 0xff;
      cVar2 = (char)uVar7;
      uVar7 = uVar6;
      if (cVar5 < cVar2) {
        uVar7 = uVar8;
      }
    }
  }
  pVVar1 = (Value *)(local_74 + 4);
  Value::Numeric(pVVar1,type,(long)(char)uVar3);
  Value::operator=(new_min,pVVar1);
  Value::~Value(pVVar1);
  pVVar1 = (Value *)(local_74 + 4);
  Value::Numeric(pVVar1,type,(long)(char)uVar7);
  Value::operator=(new_max,pVVar1);
  Value::~Value(pVVar1);
LAB_007fe620:
  return uVar9 < 2;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}